

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O1

int __thiscall
DirectionalScannerO1::first(DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  int x;
  bool *pbVar4;
  int y;
  Pt2i PStack_38;
  
  x = (this->super_DirectionalScanner).lcx;
  y = (this->super_DirectionalScanner).lcy;
  pbVar4 = (this->super_DirectionalScanner).lst2;
  iVar1 = (this->super_DirectionalScanner).ymin;
  iVar2 = (this->super_DirectionalScanner).xmax;
  if (y < iVar1 || iVar2 <= x) {
    do {
      if ((this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * x <
          (this->super_DirectionalScanner).dlc2) break;
      y = y + 1;
      x = x - (uint)*pbVar4;
      pbVar4 = pbVar4 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar4) {
        pbVar4 = (this->super_DirectionalScanner).steps;
      }
    } while (y < iVar1 || iVar2 <= x);
  }
  if ((((this->super_DirectionalScanner).dlc2 <=
        (this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * x) &&
      ((this->super_DirectionalScanner).xmin <= x)) && (y < (this->super_DirectionalScanner).ymax))
  {
    do {
      Pt2i::Pt2i(&PStack_38,x,y);
      std::vector<Pt2i,_std::allocator<Pt2i>_>::emplace_back<Pt2i>(scan,&PStack_38);
      pbVar3 = pbVar4 + 1;
      if ((this->super_DirectionalScanner).fs <= pbVar3) {
        pbVar3 = (this->super_DirectionalScanner).steps;
      }
      x = x - (uint)*pbVar4;
      y = y + 1;
    } while ((((this->super_DirectionalScanner).dlc2 <=
               (this->super_DirectionalScanner).dlb * y + (this->super_DirectionalScanner).dla * x)
             && ((this->super_DirectionalScanner).xmin <= x)) &&
            (pbVar4 = pbVar3, y < (this->super_DirectionalScanner).ymax));
  }
  return (int)((ulong)((long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(scan->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int DirectionalScannerO1::first (std::vector<Pt2i> &scan) const
{
  int x = lcx, y = lcy;      // Current position coordinates
  bool *nst = lst2;          // Current step in scan direction (jpts)

  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}